

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O1

matrix3d * tinyusdz::transpose(matrix3d *_m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  matrix3d *in_RDI;
  
  dVar1 = _m->m[0][0];
  dVar2 = _m->m[0][1];
  dVar3 = _m->m[0][2];
  dVar4 = _m->m[1][0];
  dVar5 = _m->m[1][1];
  dVar6 = _m->m[1][2];
  dVar7 = _m->m[2][0];
  dVar8 = _m->m[2][1];
  dVar9 = _m->m[2][2];
  in_RDI->m[0][1] = 0.0;
  in_RDI->m[0][2] = 0.0;
  in_RDI->m[1][2] = 0.0;
  in_RDI->m[2][0] = 0.0;
  in_RDI->m[0][0] = dVar1;
  in_RDI->m[0][1] = dVar4;
  in_RDI->m[0][2] = dVar7;
  in_RDI->m[1][0] = dVar2;
  in_RDI->m[1][1] = dVar5;
  in_RDI->m[1][2] = dVar8;
  in_RDI->m[2][0] = dVar3;
  in_RDI->m[2][1] = dVar6;
  in_RDI->m[2][2] = dVar9;
  return in_RDI;
}

Assistant:

value::matrix3d transpose(const value::matrix3d &_m) {
  matrix33d m;
  matrix33d tm;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 3 * 3);
  tm = linalg::transpose(m);

  value::matrix3d dst;

  // memory layout is same
  memcpy(&dst.m[0][0], &tm[0][0], sizeof(double) * 3 * 3);

  return dst;
}